

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_ctx.c
# Opt level: O0

BIGNUM * BN_POOL_get(BN_POOL *p,int flag)

{
  uint uVar1;
  uint in_ESI;
  long *in_RDI;
  BN_POOL_ITEM *item;
  uint loop;
  BIGNUM *bn;
  int in_stack_ffffffffffffffdc;
  uint uVar2;
  char *in_stack_ffffffffffffffe0;
  BIGNUM *a;
  BIGNUM *local_8;
  
  if ((int)in_RDI[3] == *(int *)((long)in_RDI + 0x1c)) {
    local_8 = (BIGNUM *)CRYPTO_malloc(400,"crypto/bn/bn_ctx.c",0x145);
    if (local_8 == (BIGNUM *)0x0) {
      ERR_new();
      ERR_set_debug(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,(char *)local_8);
      ERR_set_error(3,0xc0100,(char *)0x0);
      local_8 = (BIGNUM *)0x0;
    }
    else {
      uVar2 = 0;
      a = local_8;
      while (uVar1 = uVar2 + 1, uVar2 < 0x10) {
        bn_init(a);
        if ((in_ESI & 8) != 0) {
          BN_set_flags(a,8);
        }
        a = a + 1;
        uVar2 = uVar1;
      }
      local_8[0x10].d = (unsigned_long *)in_RDI[2];
      local_8[0x10].top = 0;
      local_8[0x10].dmax = 0;
      if (*in_RDI == 0) {
        in_RDI[2] = (long)local_8;
        in_RDI[1] = (long)local_8;
        *in_RDI = (long)local_8;
      }
      else {
        *(BIGNUM **)(in_RDI[2] + 0x188) = local_8;
        in_RDI[2] = (long)local_8;
        in_RDI[1] = (long)local_8;
      }
      *(int *)((long)in_RDI + 0x1c) = *(int *)((long)in_RDI + 0x1c) + 0x10;
      *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
    }
  }
  else {
    if ((int)in_RDI[3] == 0) {
      in_RDI[1] = *in_RDI;
    }
    else if ((*(uint *)(in_RDI + 3) & 0xf) == 0) {
      in_RDI[1] = *(long *)(in_RDI[1] + 0x188);
    }
    uVar2 = *(uint *)(in_RDI + 3);
    *(uint *)(in_RDI + 3) = uVar2 + 1;
    local_8 = (BIGNUM *)(in_RDI[1] + (ulong)(uVar2 & 0xf) * 0x18);
  }
  return local_8;
}

Assistant:

static BIGNUM *BN_POOL_get(BN_POOL *p, int flag)
{
    BIGNUM *bn;
    unsigned int loop;

    /* Full; allocate a new pool item and link it in. */
    if (p->used == p->size) {
        BN_POOL_ITEM *item;

        if ((item = OPENSSL_malloc(sizeof(*item))) == NULL) {
            ERR_raise(ERR_LIB_BN, ERR_R_MALLOC_FAILURE);
            return NULL;
        }
        for (loop = 0, bn = item->vals; loop++ < BN_CTX_POOL_SIZE; bn++) {
            bn_init(bn);
            if ((flag & BN_FLG_SECURE) != 0)
                BN_set_flags(bn, BN_FLG_SECURE);
        }
        item->prev = p->tail;
        item->next = NULL;

        if (p->head == NULL)
            p->head = p->current = p->tail = item;
        else {
            p->tail->next = item;
            p->tail = item;
            p->current = item;
        }
        p->size += BN_CTX_POOL_SIZE;
        p->used++;
        /* Return the first bignum from the new pool */
        return item->vals;
    }

    if (!p->used)
        p->current = p->head;
    else if ((p->used % BN_CTX_POOL_SIZE) == 0)
        p->current = p->current->next;
    return p->current->vals + ((p->used++) % BN_CTX_POOL_SIZE);
}